

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessStopJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *param_2)

{
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  (*(((aCommissioner->
      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_CommissionerHandler)._vptr_CommissionerHandler[0xd])();
  local_38._0_4_ = kNone;
  local_30._M_p = (pointer)&local_20;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  Value::Value(__return_storage_ptr__,(Error *)local_38);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStopJob(CommissionerAppPtr &aCommissioner, const Expression &)
{
    aCommissioner->Stop();
    return ERROR_NONE;
}